

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Flic.cc
# Opt level: O1

void __thiscall Flic::readBrun(Flic *this,FlicHeader *header,FlicFrame *frame,istream *is)

{
  ushort uVar1;
  ushort uVar2;
  ushort uVar3;
  void *pvVar4;
  uint uVar5;
  int iVar6;
  long lVar7;
  long lVar8;
  ulong __n;
  uint local_58;
  undefined1 local_3d;
  int local_3c;
  int iStack_38;
  uint8_t packets;
  char local_31 [8];
  char count;
  
  if (header->height != 0) {
    uVar3 = header->depth >> 3;
    __n = (ulong)uVar3;
    uVar5 = 0;
    local_3c = -1;
    do {
      std::istream::read((char *)is,(long)&local_3d);
      uVar1 = header->width;
      if (uVar1 != 0) {
        iVar6 = 0;
        do {
          uVar2 = header->height;
          iStack_38 = iVar6;
          std::istream::read((char *)is,(long)local_31);
          local_58 = (uint)uVar3;
          if (local_31[0] < '\0') {
            iVar6 = (int)local_31[0];
            if (local_31[0] < '\0') {
              lVar7 = (long)(int)(((uint)uVar1 * ((uint)uVar2 + local_3c) + iStack_38) * local_58);
              lVar8 = 0;
              do {
                pvVar4 = operator_new__((ulong)uVar3);
                std::istream::read((char *)is,(long)pvVar4);
                memcpy(frame->pixels + lVar7,pvVar4,(ulong)uVar3);
                operator_delete(pvVar4);
                lVar8 = lVar8 + 1;
                iVar6 = (int)local_31[0];
                lVar7 = lVar7 + __n;
              } while (SBORROW8(lVar8,-(long)iVar6) != lVar8 + iVar6 < 0);
            }
            iVar6 = iStack_38 - iVar6;
          }
          else {
            pvVar4 = operator_new__(__n);
            std::istream::read((char *)is,(long)pvVar4);
            if ('\0' < local_31[0]) {
              lVar7 = (long)(int)(((uint)uVar1 * ((uint)uVar2 + local_3c) + iStack_38) * local_58);
              lVar8 = 0;
              do {
                memcpy(frame->pixels + lVar7,pvVar4,__n);
                lVar8 = lVar8 + 1;
                lVar7 = lVar7 + __n;
              } while (lVar8 < local_31[0]);
            }
            iVar6 = iStack_38 + local_31[0];
            operator_delete(pvVar4);
          }
          uVar1 = header->width;
        } while (iVar6 < (int)(uint)uVar1);
      }
      uVar5 = uVar5 + 1;
      local_3c = local_3c + -1;
    } while (uVar5 < header->height);
  }
  return;
}

Assistant:

void Flic::readBrun(const FlicHeader &header, FlicFrame &frame, std::istream &is) {
	int bytespp = header.depth / 8;
	for (int y = 0; y < header.height; ++y) {
		uint8_t packets;
		is.read(reinterpret_cast<char*>(&packets), 1);
		int x = 0;
		while (x < header.width) {
			int offset = ((header.height - y - 1) * header.width + x) * bytespp;
			char count;
			is.read(&count, 1);
			if (count >= 0) {
				char *tmp = new char[bytespp];
				is.read(tmp, bytespp);
				for (int j = 0; j < count; ++j) {
					memcpy(frame.pixels + offset + j * bytespp, tmp, bytespp);
				}
				x += count;
				delete tmp;
			} else {
				for (int j = 0; j < (-count); ++j) {
					char *tmp = new char[bytespp];
					is.read(tmp, bytespp);
					memcpy(frame.pixels + offset + j * bytespp, tmp, bytespp);
					delete tmp;
				}
				x += -count;
			}
		}
	}
}